

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::PerspectiveCamera::GenerateRay
          (PerspectiveCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> t;
  Vector3f d;
  Point3<float> p;
  Vector3<float> v;
  Point3<float> p_00;
  undefined8 in_RSI;
  CameraBase *in_RDI;
  Float FVar1;
  undefined1 auVar9 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point3<float> PVar10;
  Vector3<float> VVar11;
  Point3f PVar12;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  Ray ray;
  Point3f pCamera;
  Point3f pFilm;
  float in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdcc;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffde0;
  float fVar15;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffdf0;
  float fVar17;
  undefined4 uStack_204;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  Float in_stack_fffffffffffffe1c;
  float in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar13 = SUB84(in_RDI,0);
  uVar14 = (undefined4)((ulong)in_RDI >> 0x20);
  uVar16 = (undefined4)((ulong)&stack0x00000008 >> 0x20);
  fVar17 = (float)in_RSI;
  uStack_204 = (undefined4)((ulong)in_RSI >> 0x20);
  fVar15 = 0.0;
  Point3<float>::Point3
            ((Point3<float> *)in_RDI,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,0.0);
  auVar9 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffff74;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_ffffffffffffff70;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_ffffffffffffff78;
  PVar10 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      p_00);
  auVar2._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar9;
  vmovlpd_avx(auVar2._0_16_);
  Point3<float>::Point3
            ((Point3<float> *)in_RDI,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,0.0);
  PVar10.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffde0;
  PVar10.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar14;
  PVar10.super_Tuple3<pbrt::Point3,_float>.z = fVar15;
  Vector3<float>::Vector3<float>((Vector3<float> *)0x7256ab,PVar10);
  auVar9 = ZEXT856(0);
  VVar11.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe1c;
  VVar11.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe18;
  VVar11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe20;
  VVar11 = Normalize<float>(VVar11);
  auVar3._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar9;
  vmovlpd_avx(auVar3._0_16_);
  FVar1 = CameraBase::SampleTime(in_RDI,in_stack_fffffffffffffdcc);
  Medium::Medium((Medium *)in_RDI,
                 (Medium *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  PVar12.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe10;
  PVar12.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffe08.x;
  PVar12.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffe08.y;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffdf0;
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar16;
  d.super_Tuple3<pbrt::Vector3,_float>.z = FVar1;
  Ray::Ray((Ray *)in_RDI,PVar12,d,in_stack_fffffffffffffdcc,(Medium *)0x7257be);
  if (0.0 < *(float *)(CONCAT44(uStack_204,fVar17) + 0x580)) {
    in_stack_fffffffffffffdcc = *(float *)(CONCAT44(uStack_204,fVar17) + 0x580);
    auVar4._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffe08);
    auVar4._8_56_ = extraout_var;
    vmovlpd_avx(auVar4._0_16_);
    t.y = in_stack_fffffffffffffdcc;
    t.x = in_stack_fffffffffffffdc8;
    auVar5._0_8_ = pbrt::operator*(0.0,t);
    auVar5._8_56_ = extraout_var_00;
    vmovlpd_avx(auVar5._0_16_);
    auVar9 = (undefined1  [56])0x0;
    PVar12 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe1c);
    auVar6._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar9;
    vmovlpd_avx(auVar6._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_RDI,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,0.0);
    auVar9 = ZEXT856(0);
    p.super_Tuple3<pbrt::Point3,_float>.y = FVar1;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffdf0;
    p.super_Tuple3<pbrt::Point3,_float>.z = fVar17;
    VVar11 = Point3<float>::operator-((Point3<float> *)CONCAT44(uVar14,uVar13),p);
    auVar7._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    vmovlpd_avx(auVar7._0_16_);
    auVar9 = ZEXT856(0);
    v.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe1c;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe18;
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe20;
    VVar11 = Normalize<float>(v);
    auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    vmovlpd_avx(auVar8._0_16_);
  }
  CameraBase::RenderFromCamera((CameraBase *)CONCAT44(uVar14,uVar13),(Ray *)in_RDI);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)in_RDI,in_stack_fffffffffffffdcc);
  pstd::optional<pbrt::CameraRay>::optional
            ((optional<pbrt::CameraRay> *)in_RDI,
             (CameraRay *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  return (optional<pbrt::CameraRay> *)CONCAT44(uVar14,uVar13);
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRay> PerspectiveCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(Point3f(0, 0, 0), Normalize(Vector3f(pCamera)), SampleTime(sample.time),
            medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}